

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func.h
# Opt level: O1

bool __thiscall GF2::VSubst<8UL>::IsBijection(VSubst<8UL> *this)

{
  undefined1 auVar1 [15];
  undefined1 auVar2 [14];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [14];
  undefined1 auVar7 [15];
  undefined1 auVar8 [14];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  unkuint9 Var13;
  undefined1 auVar14 [11];
  undefined1 auVar15 [14];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  word x;
  long lVar18;
  long lVar19;
  long lVar20;
  undefined1 auVar21 [15];
  BFunc<8UL> flags;
  ushort local_110 [128];
  
  lVar18 = 0;
  memset(local_110,0,0x100);
  do {
    *(undefined1 *)
     ((long)local_110 +
     (this->super_VFunc<8UL,_8UL>).super_Func<8UL,_GF2::WW<8UL>_>._vals[lVar18]._words[0]) = 1;
    lVar18 = lVar18 + 1;
  } while (lVar18 != 0x100);
  lVar18 = 0;
  lVar19 = 0;
  lVar20 = 0;
  do {
    auVar21 = ZEXT215(*(ushort *)((long)local_110 + lVar18)) ^ DAT_0013f0e0._0_15_;
    auVar1[0xd] = 0;
    auVar1._0_13_ = auVar21._0_13_;
    auVar1[0xe] = auVar21[7];
    auVar3[0xc] = auVar21[6];
    auVar3._0_12_ = auVar21._0_12_;
    auVar3._13_2_ = auVar1._13_2_;
    auVar4[0xb] = 0;
    auVar4._0_11_ = auVar21._0_11_;
    auVar4._12_3_ = auVar3._12_3_;
    auVar5[10] = auVar21[5];
    auVar5._0_10_ = auVar21._0_10_;
    auVar5._11_4_ = auVar4._11_4_;
    auVar7[9] = 0;
    auVar7._0_9_ = auVar21._0_9_;
    auVar7._10_5_ = auVar5._10_5_;
    auVar9[8] = auVar21[4];
    auVar9._0_8_ = auVar21._0_8_;
    auVar9._9_6_ = auVar7._9_6_;
    auVar12._7_8_ = 0;
    auVar12._0_7_ = auVar9._8_7_;
    Var13 = CONCAT81(SUB158(auVar12 << 0x40,7),auVar21[3]);
    auVar16._9_6_ = 0;
    auVar16._0_9_ = Var13;
    auVar14._1_10_ = SUB1510(auVar16 << 0x30,5);
    auVar14[0] = auVar21[2];
    auVar17._11_4_ = 0;
    auVar17._0_11_ = auVar14;
    auVar10[2] = auVar21[1];
    auVar10._0_2_ = auVar21._0_2_;
    auVar10._3_12_ = SUB1512(auVar17 << 0x20,3);
    auVar11._2_13_ = auVar10._2_13_;
    auVar11._0_2_ = auVar21._0_2_ & 0xff;
    auVar2._10_2_ = 0;
    auVar2._0_10_ = auVar11._0_10_;
    auVar2._12_2_ = (short)Var13;
    auVar15._2_4_ = auVar2._10_4_;
    auVar15._0_2_ = auVar14._0_2_;
    auVar15._6_8_ = 0;
    auVar6._4_2_ = auVar10._2_2_;
    auVar6._0_4_ = auVar11._0_4_;
    auVar6._6_8_ = SUB148(auVar15 << 0x40,6);
    auVar8._4_10_ = auVar6._4_10_;
    auVar8._0_4_ = auVar11._0_4_ & 0xffff;
    lVar19 = lVar19 + (auVar8._0_8_ & 0xffffffff);
    lVar20 = lVar20 + (ulong)auVar6._4_4_;
    lVar18 = lVar18 + 2;
  } while (lVar18 != 0x100);
  return lVar20 + lVar19 == 0;
}

Assistant:

bool IsBijection() const
	{	
		BFunc<_n> flags;
		for (word x = 0; x < _size; x++)
			flags[Get(x)] = true;
		return flags.Count(0) == 0;
	}